

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O0

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
          (Matrix<float,(unsigned_char)3,(unsigned_char)3> *this,float Value)

{
  ushort local_18;
  ushort local_16;
  KUINT16 j;
  KUINT16 i;
  float Value_local;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_local;
  
  for (local_16 = 0; local_16 < 3; local_16 = local_16 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      *(float *)(this + (ulong)local_18 * 4 + (ulong)local_16 * 0xc) =
           Value * *(float *)(this + (ulong)local_18 * 4 + (ulong)local_16 * 0xc);
    }
  }
  return (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)this;
}

Assistant:

Matrix & operator *= ( const T Value )
    {
        for( KUINT16 i = 0; i < cols; ++i )
        {
            for( KUINT16 j = 0; j < rows; ++j )
            {
                Data[i][j] *= Value;
            }
        }

        return *this;
    }